

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_path_append(char *path1,char *path2)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  ssize_t y;
  ssize_t x;
  size_t sep_len;
  size_t len2;
  size_t len1;
  char *rpath;
  size_t local_40;
  long local_38;
  
  local_40 = strlen(in_RDI);
  sVar2 = strlen(in_RSI);
  do {
    local_40 = local_40 - 1;
    bVar4 = false;
    if (0 < (long)local_40) {
      iVar1 = strncmp(in_RDI + local_40,"/",1);
      bVar4 = iVar1 == 0;
    }
  } while (bVar4);
  local_38 = 0;
  while( true ) {
    bVar4 = false;
    if (local_38 < (long)sVar2) {
      iVar1 = strncmp(in_RSI + local_38,"/",1);
      bVar4 = iVar1 == 0;
    }
    if (!bVar4) break;
    local_38 = local_38 + 1;
  }
  pcVar3 = zt_cstr_catv(in_RDI,0,local_40,"/",0,0xffffffff,in_RSI,local_38,0xffffffff,0);
  return pcVar3;
}

Assistant:

char *
zt_cstr_path_append(const char *path1, const char *path2) {
    char    * rpath = NULL;
    size_t    len1;
    size_t    len2;
    size_t    sep_len;
    ssize_t   x;
    ssize_t   y;

    len1    = strlen(path1);
    len2    = strlen(path2);
    sep_len = strlen(PATH_SEPERATOR);

    for (y = len1 - 1; y > 0 && strncmp(&path1[y], PATH_SEPERATOR, sep_len) == 0; y--) {
        ;
    }
    for (x = 0; x < (ssize_t)len2 && strncmp(&path2[x], PATH_SEPERATOR, sep_len) == 0; x++) {
        ;
    }

    rpath = zt_cstr_catv(path1, 0, y,
                         PATH_SEPERATOR, 0, -1,
                         path2, x, -1, NULL);
    return rpath;
}